

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

void __thiscall SimpleString::replace(SimpleString *this,char *to,char *with)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  TestMemoryAllocator *pTVar5;
  undefined4 extraout_var;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  SimpleString local_38;
  
  SimpleString(&local_38,to);
  sVar4 = count(this,&local_38);
  ~SimpleString(&local_38);
  pcVar6 = this->buffer_;
  uVar8 = 0;
  do {
    uVar15 = uVar8;
    uVar8 = uVar15 + 1;
  } while (pcVar6[uVar15] != '\0');
  lVar13 = -uVar8;
  lVar9 = -1;
  do {
    lVar13 = lVar13 + sVar4;
    lVar7 = lVar9 + 1;
    lVar9 = lVar9 + 1;
  } while (to[lVar7] != '\0');
  uVar14 = -lVar13;
  lVar13 = -1;
  do {
    uVar14 = uVar14 + sVar4;
    lVar7 = lVar13 + 1;
    lVar13 = lVar13 + 1;
  } while (with[lVar7] != '\0');
  if (uVar14 < 2) {
    pTVar5 = stringAllocator_;
    if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
      pTVar5 = defaultNewArrayAllocator();
    }
    (*pTVar5->_vptr_TestMemoryAllocator[3])
              (pTVar5,pcVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/build_O3/cpputest-master/src/CppUTest/src/CppUTest/SimpleString.cpp"
               ,0x10e);
    pcVar6 = getEmptyString((SimpleString *)pTVar5);
    this->buffer_ = pcVar6;
  }
  else {
    pTVar5 = stringAllocator_;
    if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
      pTVar5 = defaultNewArrayAllocator();
    }
    iVar3 = (*pTVar5->_vptr_TestMemoryAllocator[2])
                      (pTVar5,uVar14,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/build_O3/cpputest-master/src/CppUTest/src/CppUTest/SimpleString.cpp"
                       ,0xfc);
    pcVar6 = (char *)CONCAT44(extraout_var,iVar3);
    if (uVar8 != 1) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        if (lVar9 != 0) {
          lVar10 = 0;
          do {
            cVar1 = (this->buffer_ + uVar8)[lVar10];
            if ((cVar1 == '\0') || (cVar1 != to[lVar10])) {
              if (cVar1 != to[lVar10]) {
                pcVar6[lVar7] = this->buffer_[uVar8];
                lVar10 = 1;
                lVar12 = 1;
                goto LAB_001a180b;
              }
              break;
            }
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
        }
        lVar10 = lVar9;
        lVar12 = lVar13;
        if (lVar13 != -1 && pcVar6 != (char *)0x0) {
          lVar11 = 0;
          do {
            cVar1 = with[lVar11];
            pcVar6[lVar11 + lVar7] = cVar1;
            if (cVar1 == '\0') break;
            bVar16 = lVar13 != lVar11;
            lVar11 = lVar11 + 1;
          } while (bVar16);
        }
LAB_001a180b:
        lVar7 = lVar7 + lVar12;
        uVar8 = uVar8 + lVar10;
      } while (uVar8 < uVar15);
    }
    pcVar2 = this->buffer_;
    pTVar5 = stringAllocator_;
    if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
      pTVar5 = defaultNewArrayAllocator();
    }
    (*pTVar5->_vptr_TestMemoryAllocator[3])
              (pTVar5,pcVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/build_O3/cpputest-master/src/CppUTest/src/CppUTest/SimpleString.cpp"
               ,0x109);
    this->buffer_ = pcVar6;
    pcVar6[uVar14 - 1] = '\0';
  }
  return;
}

Assistant:

void SimpleString::replace(const char* to, const char* with)
{
    size_t c = count(to);
    size_t len = size();
    size_t tolen = StrLen(to);
    size_t withlen = StrLen(with);

    size_t newsize = len + (withlen * c) - (tolen * c) + 1;

    if (newsize > 1) {
        char* newbuf = allocStringBuffer(newsize, __FILE__, __LINE__);
        for (size_t i = 0, j = 0; i < len;) {
            if (StrNCmp(&buffer_[i], to, tolen) == 0) {
                StrNCpy(&newbuf[j], with, withlen + 1);
                j += withlen;
                i += tolen;
            }
            else {
                newbuf[j] = buffer_[i];
                j++;
                i++;
            }
        }
        deallocStringBuffer(buffer_, __FILE__, __LINE__);
        buffer_ = newbuf;
        buffer_[newsize - 1] = '\0';
    }
    else {
        deallocStringBuffer(buffer_, __FILE__, __LINE__);
        buffer_ = getEmptyString();
    }
}